

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O0

char * Io_NtkDeriveSop(Mem_Flex_t *pMem,word uTruth,int nVars,Vec_Int_t *vCover)

{
  int iVar1;
  int iVar2;
  Mem_Flex_t *local_58;
  char *pStr1;
  char *pStr0;
  int RetValue;
  char *pSop;
  Vec_Int_t *vCover_local;
  word wStack_20;
  int nVars_local;
  word uTruth_local;
  Mem_Flex_t *pMem_local;
  
  wStack_20 = uTruth;
  uTruth_local = (word)pMem;
  iVar1 = Kit_TruthIsop((uint *)&stack0xffffffffffffffe0,nVars,vCover,1);
  if ((iVar1 != 0) && (iVar1 != 1)) {
    __assert_fail("RetValue == 0 || RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                  ,800,"char *Io_NtkDeriveSop(Mem_Flex_t *, word, int, Vec_Int_t *)");
  }
  iVar2 = Vec_IntSize(vCover);
  if ((iVar2 == 0) ||
     ((iVar2 = Vec_IntSize(vCover), iVar2 == 1 && (iVar2 = Vec_IntEntry(vCover,0), iVar2 == 0)))) {
    if (iVar1 != 0) {
      __assert_fail("RetValue == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                    ,0x325,"char *Io_NtkDeriveSop(Mem_Flex_t *, word, int, Vec_Int_t *)");
    }
    iVar1 = Vec_IntSize(vCover);
    if (iVar1 == 0) {
      local_58 = (Mem_Flex_t *)0xca3475;
    }
    else {
      local_58 = (Mem_Flex_t *)0xcd8aac;
    }
    pMem_local = local_58;
  }
  else {
    pMem_local = (Mem_Flex_t *)Abc_SopCreateFromIsop((Mem_Flex_t *)uTruth_local,nVars,vCover);
    if (iVar1 != 0) {
      Abc_SopComplement((char *)pMem_local);
    }
  }
  return (char *)pMem_local;
}

Assistant:

char * Io_NtkDeriveSop( Mem_Flex_t * pMem, word uTruth, int nVars, Vec_Int_t * vCover )
{
    char * pSop;
    int RetValue = Kit_TruthIsop( (unsigned *)&uTruth, nVars, vCover, 1 );
    assert( RetValue == 0 || RetValue == 1 );
    // check the case of constant cover
    if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
    {
        char * pStr0 = " 0\n", * pStr1 = " 1\n";
        assert( RetValue == 0 );
        return Vec_IntSize(vCover) == 0 ? pStr0 : pStr1;
    }
    // derive the AIG for that tree
    pSop = Abc_SopCreateFromIsop( pMem, nVars, vCover );
    if ( RetValue )
        Abc_SopComplement( pSop );
    return pSop;
}